

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint __thiscall crnlib::symbol_codec::decode_bits(symbol_codec *this,uint num_bits)

{
  uint uVar1;
  uint uVar2;
  uint in_ESI;
  uint b;
  uint a;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else if (in_ESI < 0x11) {
    local_4 = get_bits((symbol_codec *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                       in_stack_ffffffffffffffe4);
  }
  else {
    uVar1 = get_bits((symbol_codec *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                     in_stack_ffffffffffffffe4);
    uVar2 = get_bits((symbol_codec *)CONCAT44(in_ESI,uVar1),in_stack_ffffffffffffffe4);
    local_4 = uVar1 << 0x10 | uVar2;
  }
  return local_4;
}

Assistant:

uint symbol_codec::decode_bits(uint num_bits) {
  CRNLIB_ASSERT(m_mode == cDecoding);

  if (!num_bits)
    return 0;

  if (num_bits > 16) {
    uint a = get_bits(num_bits - 16);
    uint b = get_bits(16);

    return (a << 16) | b;
  } else
    return get_bits(num_bits);
}